

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O3

void __thiscall Js::BigUInt::Subtract(BigUInt *this,BigUInt *pbi)

{
  ulong uVar1;
  code *pcVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  AssertValid(this,true);
  if (pbi == (BigUInt *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x18d,"(pbi)","pbi");
    if (!bVar4) goto LAB_0068e580;
    *puVar7 = 0;
  }
  AssertValid(pbi,true);
  if (this == pbi) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x18e,"(this != pbi)","this != pbi");
    if (!bVar4) goto LAB_0068e580;
    *puVar7 = 0;
  }
  uVar8 = this->m_clu;
  if ((int)uVar8 < pbi->m_clu) {
LAB_0068e4e9:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x1b0,"(false)","Who\'s subtracting to negative?");
    if (!bVar4) {
LAB_0068e580:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
LAB_0068e53a:
    iVar6 = 0;
  }
  else {
    if (pbi->m_clu < 1) {
      uVar9 = 0;
    }
    else {
      uVar5 = 1;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar10 = 0;
      do {
        if ((long)pbi->m_cluMax <= (long)uVar10) break;
        if (1 < uVar5) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                      ,0x19a,"(wCarry == 0 || wCarry == 1)",
                                      "wCarry == 0 || wCarry == 1");
          if (!bVar4) goto LAB_0068e580;
          *puVar7 = 0;
        }
        if ((pbi->m_prglu[uVar10] != 0) || (uVar5 == 0)) {
          uVar5 = NumberUtilities::AddLu(this->m_prglu + uVar10,uVar5 + ~pbi->m_prglu[uVar10]);
        }
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)pbi->m_clu);
      uVar9 = (uint)uVar10;
      uVar8 = this->m_clu;
      bVar4 = uVar5 == 0;
      if (((bVar4) && ((int)uVar9 < (int)uVar8)) && ((int)uVar9 < this->m_cluMax)) {
        do {
          iVar6 = NumberUtilities::AddLu(this->m_prglu + (uVar10 & 0xffffffff),0xffffffff);
          uVar8 = this->m_clu;
          bVar4 = iVar6 == 0;
          if ((!bVar4) || ((int)uVar8 <= (int)uVar9)) break;
        } while ((int)uVar9 < this->m_cluMax);
      }
      if (bVar4) goto LAB_0068e4e9;
    }
    if (uVar9 != uVar8) goto LAB_0068e53f;
    uVar10 = (ulong)uVar9;
    do {
      if ((long)uVar10 < 1) goto LAB_0068e53a;
      uVar1 = uVar10 - 1;
      lVar3 = uVar10 - 1;
      uVar10 = uVar1;
    } while (this->m_prglu[lVar3] == 0);
    iVar6 = (int)uVar1 + 1;
  }
  this->m_clu = iVar6;
LAB_0068e53f:
  AssertValid(this,true);
  return;
}

Assistant:

void BigUInt::Subtract(BigUInt *pbi)
    {
        AssertBi(this);
        AssertBi(pbi);
        Assert(this != pbi);

        int32 ilu;
        int wCarry;
        uint32 luT;

        if (m_clu < pbi->m_clu)
            goto LNegative;

        wCarry = 1;
        for (ilu = 0; (ilu < pbi->m_clu) && (ilu < pbi->m_cluMax); ilu++)
        {
            Assert(wCarry == 0 || wCarry == 1);
            luT = pbi->m_prglu[ilu];

            // NOTE: We should really do:
            //    wCarry = AddLu(&m_prglu[ilu], wCarry);
            //    wCarry += AddLu(&m_prglu[ilu], ~luT);
            // The only case where this is different than
            //    wCarry = AddLu(&m_prglu[ilu], ~luT + wCarry);
            // is when luT == 0 and 1 == wCarry, in which case we don't
            // need to add anything and wCarry should still be 1, so we can
            // just skip the operations.

            if (0 != luT || 0 == wCarry)
                wCarry = NumberUtilities::AddLu(&m_prglu[ilu], ~luT + wCarry);
        }
        while ((0 == wCarry) && (ilu < m_clu) && (ilu < m_cluMax))
            wCarry = NumberUtilities::AddLu(&m_prglu[ilu], 0xFFFFFFFF);

        if (0 == wCarry)
        {
LNegative:
            // pbi was bigger than this.
            AssertMsg(false, "Who's subtracting to negative?");
            m_clu = 0;
        }
        else if (ilu == m_clu)
        {
            // Trim off zeros.
            while (--ilu >= 0 && 0 == m_prglu[ilu])
                ;
            m_clu = ilu + 1;
        }

        AssertBi(this);
    }